

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O0

void __thiscall trng::lcg64_shift::jump(lcg64_shift *this,unsigned_long_long s)

{
  lcg64_shift *in_RSI;
  lcg64_shift *in_RDI;
  uint i_1;
  uint i;
  uint in_stack_ffffffffffffffec;
  uint uVar1;
  
  if (in_RSI < (lcg64_shift *)0x10) {
    for (uVar1 = 0; (lcg64_shift *)(ulong)uVar1 < in_RSI; uVar1 = uVar1 + 1) {
      step(in_RDI);
    }
  }
  else {
    for (; in_RSI != (lcg64_shift *)0x0; in_RSI = (lcg64_shift *)((ulong)in_RSI >> 1)) {
      if (((ulong)in_RSI & 1) == 1) {
        jump2(in_RSI,in_stack_ffffffffffffffec);
      }
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_shift::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      unsigned int i{0};
      while (s > 0) {
        if (s % 2 == 1)
          jump2(i);
        ++i;
        s >>= 1u;
      }
    }
  }